

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cc
# Opt level: O3

string * __thiscall
re2::FormatMode_abi_cxx11_(string *__return_storage_ptr__,re2 *this,ParseFlags flags)

{
  long lVar1;
  string *psVar2;
  string *extraout_RAX;
  
  lVar1 = 0x10;
  do {
    if (*(int *)(lVar1 + 0x157240) == (int)this) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,*(long *)((long)&multi_line + lVar1),
                 *(long *)((long)&parse_modes + lVar1) + *(long *)((long)&multi_line + lVar1));
      return extraout_RAX;
    }
    lVar1 = lVar1 + 0x28;
  } while (lVar1 != 0xd8);
  psVar2 = StringPrintf_abi_cxx11_(__return_storage_ptr__,"%#x");
  return psVar2;
}

Assistant:

static string FormatMode(Regexp::ParseFlags flags) {
  for (int i = 0; i < arraysize(parse_modes); i++)
    if (parse_modes[i].parse_flags == flags)
      return parse_modes[i].desc;
  return StringPrintf("%#x", static_cast<uint>(flags));
}